

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureMipmapTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Accuracy::Texture2DMipmapCase::iterate(Texture2DMipmapCase *this)

{
  uint uVar1;
  CoordType CVar2;
  CoordType CVar3;
  Texture2D *pTVar4;
  TestLog *pTVar5;
  RenderContext *context;
  TestContext *this_00;
  int iVar6;
  int height;
  Texture2DMipmapCase *pTVar7;
  pointer pfVar8;
  int iVar9;
  deUint32 dVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 *puVar12;
  undefined4 extraout_var_01;
  NotSupportedError *this_01;
  long lVar13;
  tcu *ptVar14;
  long lVar15;
  int col;
  long lVar16;
  long lVar17;
  int col_2;
  int iVar18;
  int iVar19;
  uint uVar20;
  bool bVar21;
  float v;
  undefined4 uVar22;
  float fVar23;
  Vec2 p3;
  Vec2 p2;
  Vec2 p1;
  RandomViewport viewport;
  Mat2 shearMatrix;
  Vec2 p0;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Mat2 transform;
  Surface idealFrame;
  ReferenceParams sampleParams;
  Mat2 rotMatrix;
  TextureFormatInfo fmtInfo;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  int local_36c;
  RandomViewport local_368;
  undefined1 local_358 [8];
  Vector<float,_2> VStack_350;
  long local_348 [3];
  Texture2DMipmapCase *local_330;
  float local_328 [4];
  vector<float,_std::allocator<float>_> local_318;
  long local_300;
  Surface local_2f8;
  tcu local_2e0 [16];
  TestLog *local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  TextureRenderer *local_2b8;
  long local_2b0;
  long local_2a8;
  undefined8 local_2a0;
  Surface local_298;
  undefined1 local_27c [76];
  float afStack_230 [2];
  FilterMode local_228;
  float fStack_224;
  int aiStack_220 [2];
  void *local_218;
  undefined4 local_210;
  undefined8 local_20c;
  bool bStack_204;
  undefined3 uStack_203;
  DepthStencilMode DStack_200;
  LodMode local_1fc;
  undefined1 local_1e8 [8];
  Vector<float,_2> VStack_1e0;
  FilterMode local_1d8;
  float fStack_1d4;
  int aiStack_1d0 [2];
  void *local_1c8;
  undefined4 local_1c0;
  undefined8 local_1bc;
  bool bStack_1b4;
  undefined3 uStack_1b3;
  DepthStencilMode DStack_1b0;
  ios_base local_178 [264];
  TextureFormatInfo local_70;
  
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_300 = CONCAT44(extraout_var,iVar9);
  pTVar4 = this->m_texture;
  pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::getTextureFormatInfo(&local_70,(TextureFormat *)&pTVar4->m_refTexture);
  uVar20 = (pTVar4->m_refTexture).m_width;
  local_2c8 = (ulong)uVar20;
  uVar1 = (pTVar4->m_refTexture).m_height;
  local_2c0 = (ulong)uVar1;
  iVar18 = uVar20 * 4;
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar10 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_368,(RenderTarget *)CONCAT44(extraout_var_00,iVar9),iVar18,uVar1 * 4,dVar10);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_27c,TEXTURETYPE_2D);
  local_318.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_318.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_318.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CVar2 = this->m_coordType;
  tcu::Surface::Surface(&local_2f8,local_368.width,local_368.height);
  tcu::Surface::Surface(&local_298,local_368.width,local_368.height);
  local_36c = local_368.width + 3;
  if (-1 < local_368.width) {
    local_36c = local_368.width;
  }
  iVar9 = local_368.height + 3;
  if (-1 < local_368.height) {
    iVar9 = local_368.height;
  }
  if ((local_368.width < iVar18) ||
     (SBORROW4(local_368.height,uVar1 * 4) != (int)(local_368.height + uVar1 * -4) < 0)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureMipmapTests.cpp"
               ,0x112);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)local_1e8,this->m_wrapS,this->m_wrapT,this->m_minFilter,0x2600);
  local_228 = local_1d8;
  fStack_224 = fStack_1d4;
  aiStack_220[0] = aiStack_1d0[0];
  aiStack_220[1] = aiStack_1d0[1];
  local_27c._68_8_ = local_1e8;
  afStack_230[0] = VStack_1e0.m_data[0];
  afStack_230[1] = VStack_1e0.m_data[1];
  local_218 = local_1c8;
  local_210 = local_1c0;
  local_20c = local_1bc;
  bStack_204 = bStack_1b4;
  uStack_203 = uStack_1b3;
  DStack_200 = DStack_1b0;
  local_27c._4_4_ =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  lVar15 = local_300;
  local_27c._52_4_ = local_70.lookupBias.m_data[0];
  local_27c._56_4_ = local_70.lookupBias.m_data[1];
  local_27c._60_4_ = local_70.lookupBias.m_data[2];
  local_27c._64_4_ = local_70.lookupBias.m_data[3];
  local_27c._36_4_ = local_70.lookupScale.m_data[0];
  local_27c._40_4_ = local_70.lookupScale.m_data[1];
  local_27c._44_4_ = local_70.lookupScale.m_data[2];
  local_27c._48_4_ = local_70.lookupScale.m_data[3];
  local_27c._8_4_ = (uint)(CVar2 == COORDTYPE_PROJECTED) + (uint)(CVar2 == COORDTYPE_BASIC_BIAS) * 2
  ;
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar15 + 8))(0x84c0);
  (**(code **)(lVar15 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar15 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar15 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar15 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar15 + 0x1360))(0xde1,0x2800,0x2600);
  dVar10 = (**(code **)(lVar15 + 0x800))();
  glu::checkError(dVar10,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureMipmapTests.cpp"
                  ,0x128);
  local_2d0 = pTVar5;
  if (iterate()::s_projections == '\0') {
    iterate();
  }
  local_36c = local_36c >> 2;
  local_2b8 = &this->m_renderer;
  lVar15 = 0;
  local_330 = this;
  do {
    iVar18 = (iVar9 >> 2) * (int)lVar15;
    local_2a8 = lVar15 * 4;
    lVar17 = 0;
    local_2b0 = lVar15;
    do {
      iVar19 = local_36c * (int)lVar17;
      lVar15 = lVar17 + 1;
      iVar6 = local_368.width - iVar19;
      if (lVar15 != 4) {
        iVar6 = local_36c;
      }
      height = local_368.height - iVar18;
      if (local_2b0 != 3) {
        height = iVar9 >> 2;
      }
      uVar20 = (int)lVar17 + (int)local_2a8;
      CVar3 = local_330->m_coordType;
      if (CVar3 < COORDTYPE_AFFINE) {
LAB_0044664d:
        getBasicTexCoord2D(&local_318,uVar20);
      }
      else if (CVar3 == COORDTYPE_AFFINE) {
        getBasicTexCoord2D(&local_318,uVar20);
        local_1e8._0_4_ = R;
        local_1e8._4_4_ = SNORM_INT8;
        VStack_1e0.m_data[0] = 0.0;
        VStack_1e0.m_data[1] = 0.0;
        puVar12 = local_1e8;
        lVar13 = 0;
        do {
          lVar16 = 0;
          do {
            uVar22 = 0x3f800000;
            if (lVar13 != lVar16) {
              uVar22 = 0;
            }
            *(undefined4 *)(puVar12 + lVar16 * 8) = uVar22;
            lVar16 = lVar16 + 1;
          } while (lVar16 == 1);
          puVar12 = puVar12 + 4;
          bVar21 = lVar13 == 0;
          lVar13 = lVar13 + 1;
        } while (bVar21);
        local_328[2] = (float)(int)uVar20 * 0.0625 * 6.2831855;
        local_328[3] = cosf(local_328[2]);
        local_1e8._4_4_ = sinf(local_328[2]);
        local_1e8._0_4_ = local_328[3];
        VStack_1e0.m_data = (float  [2])(CONCAT44(local_328[3],local_1e8._4_4_) ^ 0x80000000);
        puVar12 = local_358;
        lVar13 = 0;
        do {
          lVar16 = 0;
          do {
            uVar22 = 0x3f800000;
            if (lVar13 != lVar16) {
              uVar22 = 0;
            }
            *(undefined4 *)(puVar12 + lVar16 * 8) = uVar22;
            lVar16 = lVar16 + 1;
          } while (lVar16 == 1);
          puVar12 = puVar12 + 4;
          bVar21 = lVar13 == 0;
          lVar13 = lVar13 + 1;
        } while (bVar21);
        VStack_350.m_data[0] = (float)(int)(0xf - uVar20) * 0.0625;
        if (7 < uVar20 - 4) {
          VStack_350.m_data[0] = 0.0;
        }
        local_358._0_4_ = 0x3f800000;
        local_358._4_4_ = SNORM_INT8;
        VStack_350.m_data[1] = VStack_350.m_data[0] * 0.0 + 1.0;
        tcu::operator*(local_2e0,(Matrix<float,_2,_2> *)local_1e8,(Matrix<float,_2,_2> *)local_358);
        pfVar8 = local_318.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_378 = *(undefined8 *)
                     local_318.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
        local_328[0] = 0.0;
        local_328[1] = 0.0;
        ptVar14 = local_2e0;
        lVar13 = 0;
        do {
          fVar23 = 0.0;
          lVar16 = 0;
          do {
            fVar23 = fVar23 + *(float *)(ptVar14 + lVar16 * 8) *
                              *(float *)((long)&local_378 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (lVar16 == 1);
          local_328[lVar13] = fVar23;
          ptVar14 = ptVar14 + 4;
          bVar21 = lVar13 == 0;
          lVar13 = lVar13 + 1;
        } while (bVar21);
        local_380 = *(undefined8 *)(pfVar8 + 2);
        local_378 = 0;
        ptVar14 = local_2e0;
        lVar13 = 0;
        do {
          fVar23 = 0.0;
          lVar16 = 0;
          do {
            fVar23 = fVar23 + *(float *)(ptVar14 + lVar16 * 8) *
                              *(float *)((long)&local_380 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (lVar16 == 1);
          *(float *)((long)&local_378 + lVar13 * 4) = fVar23;
          ptVar14 = ptVar14 + 4;
          bVar21 = lVar13 == 0;
          lVar13 = lVar13 + 1;
        } while (bVar21);
        local_388 = *(undefined8 *)(pfVar8 + 4);
        local_380 = 0;
        ptVar14 = local_2e0;
        lVar13 = 0;
        do {
          fVar23 = 0.0;
          lVar16 = 0;
          do {
            fVar23 = fVar23 + *(float *)(ptVar14 + lVar16 * 8) *
                              *(float *)((long)&local_388 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (lVar16 == 1);
          *(float *)((long)&local_380 + lVar13 * 4) = fVar23;
          ptVar14 = ptVar14 + 4;
          bVar21 = lVar13 == 0;
          lVar13 = lVar13 + 1;
        } while (bVar21);
        local_2a0 = *(undefined8 *)(pfVar8 + 6);
        local_388 = 0;
        ptVar14 = local_2e0;
        lVar13 = 0;
        do {
          fVar23 = 0.0;
          lVar16 = 0;
          do {
            fVar23 = fVar23 + *(float *)(ptVar14 + lVar16 * 8) *
                              *(float *)((long)&local_2a0 + lVar16 * 4);
            lVar16 = lVar16 + 1;
          } while (lVar16 == 1);
          *(float *)((long)&local_388 + lVar13 * 4) = fVar23;
          ptVar14 = ptVar14 + 4;
          bVar21 = lVar13 == 0;
          lVar13 = lVar13 + 1;
        } while (bVar21);
        *pfVar8 = local_328[0];
        pfVar8[1] = local_328[1];
        pfVar8[2] = (float)local_378;
        pfVar8[3] = local_378._4_4_;
        pfVar8[4] = (float)local_380;
        pfVar8[5] = local_380._4_4_;
        pfVar8[6] = (float)local_388;
        pfVar8[7] = local_388._4_4_;
      }
      else if (CVar3 == COORDTYPE_PROJECTED) goto LAB_0044664d;
      if (CVar2 == COORDTYPE_PROJECTED) {
        local_27c._12_4_ = iterate::s_projections[lVar17].m_data[0];
        local_27c._16_4_ = iterate::s_projections[lVar17].m_data[1];
        local_27c._20_4_ = iterate::s_projections[lVar17].m_data[2];
        local_27c._24_4_ = iterate::s_projections[lVar17].m_data[3];
      }
      if (CVar2 == COORDTYPE_BASIC_BIAS) {
        local_27c._28_4_ = iterate::s_bias[uVar20 & 7];
      }
      (**(code **)(local_300 + 0x1a00))(local_368.x + iVar19,local_368.y + iVar18,iVar6,height);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (local_2b8,0,
                 local_318.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(RenderParams *)local_27c);
      pTVar7 = local_330;
      iVar11 = (*local_330->m_renderCtx->_vptr_RenderContext[4])();
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_1e8,&local_298,
                 (PixelFormat *)(CONCAT44(extraout_var_01,iVar11) + 8),iVar19,iVar18,iVar6,height);
      local_1fc = LODMODE_EXACT;
      VStack_350.m_data = (float  [2])(pTVar7->m_texture->m_refTexture).m_view.m_levels;
      local_358._0_4_ = (pTVar7->m_texture->m_refTexture).m_view.m_numLevels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_1e8,(Texture2DView *)local_358,
                 local_318.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_27c);
      pTVar7 = local_330;
      lVar17 = lVar15;
    } while (lVar15 != 4);
    lVar15 = local_2b0 + 1;
    if (lVar15 == 4) {
      context = local_330->m_renderCtx;
      local_358._0_4_ = RGBA;
      local_358._4_4_ = UNORM_INT8;
      if ((void *)local_2f8.m_pixels.m_cap != (void *)0x0) {
        local_2f8.m_pixels.m_cap = (size_t)local_2f8.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1e8,(TextureFormat *)local_358,local_2f8.m_width,
                 local_2f8.m_height,1,(void *)local_2f8.m_pixels.m_cap);
      pTVar5 = local_2d0;
      glu::readPixels(context,local_368.x,local_368.y,(PixelBufferAccess *)local_1e8);
      iVar9 = (int)local_2c8;
      iVar18 = iVar9 + 0xf;
      if (-1 < iVar9) {
        iVar18 = iVar9;
      }
      iVar6 = (int)local_2c0;
      iVar19 = iVar6 + 0xf;
      if (-1 < iVar6) {
        iVar19 = iVar6;
      }
      iVar9 = glu::TextureTestUtil::measureAccuracy
                        (pTVar5,&local_298,&local_2f8,(iVar19 >> 4) * (iVar18 >> 4),iVar6 * iVar9);
      this_00 = (pTVar7->super_TestCase).super_TestNode.m_testCtx;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
      std::ostream::operator<<(local_1e8,iVar9);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
      std::ios_base::~ios_base(local_178);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_358);
      if (local_358 != (undefined1  [8])local_348) {
        operator_delete((void *)local_358,local_348[0] + 1);
      }
      tcu::Surface::~Surface(&local_298);
      tcu::Surface::~Surface(&local_2f8);
      if (local_318.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_318.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_318.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_318.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

Texture2DMipmapCase::IterateResult Texture2DMipmapCase::iterate (void)
{
	// Constants.
	const deUint32				magFilter			= GL_NEAREST;

	const glw::Functions&		gl					= m_renderCtx.getFunctions();
	TestLog&					log					= m_testCtx.getLog();

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&	texFmt				= refTexture.getFormat();
	tcu::TextureFormatInfo		fmtInfo				= tcu::getTextureFormatInfo(texFmt);

	int							texWidth			= refTexture.getWidth();
	int							texHeight			= refTexture.getHeight();
	int							defViewportWidth	= texWidth*4;
	int							defViewportHeight	= texHeight*4;

	RandomViewport				viewport			(m_renderCtx.getRenderTarget(), defViewportWidth, defViewportHeight, deStringHash(getName()));
	ReferenceParams				sampleParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;

	bool						isProjected			= m_coordType == COORDTYPE_PROJECTED;
	bool						useLodBias			= m_coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Accuracy cases test against ideal lod computation.
	tcu::Surface				idealFrame			(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	int							gridWidth			= 4;
	int							gridHeight			= 4;
	int							cellWidth			= viewport.width / gridWidth;
	int							cellHeight			= viewport.height / gridHeight;

	// Accuracy measurements are off unless we get the expected viewport size.
	if (viewport.width < defViewportWidth || viewport.height < defViewportHeight)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, magFilter);
	sampleParams.samplerType	= glu::TextureTestUtil::getSamplerType(m_texture->getRefTexture().getFormat());
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;
	sampleParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);

	// Upload texture data.
	m_texture->upload();

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int				curX		= cellWidth*gridX;
			int				curY		= cellHeight*gridY;
			int				curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int				curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int				cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				sampleParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				sampleParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);

			// Render reference(s).
			{
				tcu::SurfaceAccess idealDst(idealFrame, m_renderCtx.getRenderTarget().getPixelFormat(), curX, curY, curW, curH);
				sampleParams.lodMode = LODMODE_EXACT;
				sampleTexture(idealDst, m_texture->getRefTexture(), &texCoord[0], sampleParams);
			}
		}
	}

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const int	bestScoreDiff	= (texWidth/16)*(texHeight/16);
		const int	worstScoreDiff	= texWidth*texHeight;

		int score = measureAccuracy(log, idealFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}